

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

ptls_cipher_suite_t * get_aes128gcmsha256(quicly_context_t *ctx)

{
  long *in_RDI;
  ptls_cipher_suite_t **cs;
  undefined8 *local_10;
  
  local_10 = *(undefined8 **)(*in_RDI + 0x18);
  while( true ) {
    if (local_10 == (undefined8 *)0x0) {
      __assert_fail("cs != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x210,"ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *)");
    }
    if (*(short *)*local_10 == 0x1301) break;
    local_10 = local_10 + 1;
  }
  return (ptls_cipher_suite_t *)*local_10;
}

Assistant:

static ptls_cipher_suite_t *get_aes128gcmsha256(quicly_context_t *ctx)
{
    ptls_cipher_suite_t **cs;

    for (cs = ctx->tls->cipher_suites;; ++cs) {
        assert(cs != NULL);
        if ((*cs)->id == PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)
            break;
    }
    return *cs;
}